

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

void __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::utilize_exec_list(timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                    *this,timer_type *head)

{
  long *plVar1;
  timer_type *ptVar2;
  long lVar3;
  long lVar4;
  
LAB_00238386:
  do {
    if (head == (timer_type *)0x0) {
      return;
    }
    ptVar2 = head->m_next;
    lVar3 = (head->m_period).__r;
    if (*(int *)&(head->super_timer_object<timertt::thread_safety::unsafe>).field_0xc == 2) {
      lVar4 = 0x40;
      if (lVar3 != 0) {
        (head->m_when).__d.__r = (head->m_when).__d.__r + lVar3;
        *(undefined4 *)&(head->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 1;
        insert_timer_to_list(this,head);
        head = ptVar2;
        goto LAB_00238386;
      }
    }
    else {
      lVar4 = (ulong)(lVar3 != 0) * 8 + 0x40;
    }
    plVar1 = (long *)((long)&(this->
                             super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                             ).m_error_logger.super__Function_base._M_functor + lVar4);
    *plVar1 = *plVar1 + -1;
    *(undefined4 *)&(head->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 0;
    timer_object<timertt::thread_safety::unsafe>::decrement_references
              (&head->super_timer_object<timertt::thread_safety::unsafe>);
    head = ptVar2;
  } while( true );
}

Assistant:

void
	utilize_exec_list(
		//! Head of execution list.
		//! Cannot be null.
		timer_type * head )
	{
		while( head )
		{
			auto t = head;
			head = head->m_next;

			// Actual periodic timer must be rescheduled.
			if( timer_status::wait_for_execution == t->m_status &&
					monotonic_clock::duration::zero() != t->m_period )
			{
				t->m_when += t->m_period;
				t->m_status = timer_status::active;

				insert_timer_to_list( t );
			}
			else
			{
				// Timer must be utilized.
				this->dec_timer_count( t->kind() );
				t->m_status = timer_status::deactivated;
				timer_object< THREAD_SAFETY >::decrement_references( t );
			}
		}
	}